

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlledLifetimeResource.h
# Opt level: O0

void __thiscall
Rml::ControlledLifetimeResource<Rml::ElementInstancerPools>::Shutdown
          (ControlledLifetimeResource<Rml::ElementInstancerPools> *this)

{
  ElementInstancerPools *this_00;
  code *pcVar1;
  bool bVar2;
  ControlledLifetimeResource<Rml::ElementInstancerPools> *this_local;
  
  if ((this->pointer == (ElementInstancerPools *)0x0) &&
     (bVar2 = Assert("Shutting down resource that was not initialized, or has been shut down already."
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                     ,0x3e), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if (((this->intentionally_leaked & 1U) != 0) &&
     (bVar2 = Assert("Shutting down resource that was marked as leaked.",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                     ,0x3f), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  this_00 = this->pointer;
  if (this_00 != (ElementInstancerPools *)0x0) {
    ElementInstancerPools::~ElementInstancerPools(this_00);
    operator_delete(this_00,0x50);
  }
  this->pointer = (ElementInstancerPools *)0x0;
  return;
}

Assistant:

void Shutdown()
	{
		RMLUI_ASSERTMSG(pointer, "Shutting down resource that was not initialized, or has been shut down already.");
		RMLUI_ASSERTMSG(!intentionally_leaked, "Shutting down resource that was marked as leaked.");
		delete pointer;
		pointer = nullptr;
	}